

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey(ExtPrivkey *this,ByteData *seed,NetType network_type)

{
  ulong uVar1;
  CfdException *pCVar2;
  uint32_t version;
  int ret;
  allocator local_159;
  Privkey *local_158;
  ByteData256 *local_150;
  string local_148;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> seed_byte;
  ext_key extkey;
  
  ByteData::ByteData(&this->serialize_data_);
  this->child_num_ = 0;
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  ByteData256::ByteData256(&this->chaincode_);
  local_150 = &this->chaincode_;
  Privkey::Privkey(&this->privkey_);
  local_158 = &this->privkey_;
  ByteData256::ByteData256(&this->tweak_sum_);
  ByteData::GetBytes(&seed_byte,seed);
  uVar1 = ((long)seed_byte.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
          (long)seed_byte.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) - 0x10;
  if ((0x30 < uVar1) || ((0x1000000010001U >> (uVar1 & 0x3f) & 1) == 0)) {
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&extkey,"ExtPrivkey Seed length error.",(allocator *)&local_148);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&extkey);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  version = 0x4358394;
  if (network_type == kLiquidV1) {
    version = 0x488ade4;
  }
  if (network_type == kMainnet) {
    version = 0x488ade4;
  }
  ret = bip32_key_from_seed(seed_byte.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)seed_byte.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)seed_byte.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,version,0,&extkey);
  if (ret == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,0x4e,
               (allocator_type *)&local_148);
    ret = bip32_key_serialize(&extkey,0,
                              data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    if (ret == 0) {
      ByteData::ByteData((ByteData *)&local_148,&data);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148);
      AnalyzeBip32KeyData(&extkey,(string *)0x0,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                          &this->version_,&this->depth_,&this->child_num_,local_150,local_158,
                          (Pubkey *)0x0,&this->fingerprint_);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&seed_byte.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return;
    }
    local_148._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
    local_148._M_string_length._0_4_ = 0x1b9;
    local_148.field_2._M_allocated_capacity = (long)"kCfdExtPrivkey" + 4;
    logger::warn<int&>((CfdSourceLocation *)&local_148,"bip32_key_serialize error. ret={}",&ret);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&local_148,"ExtPrivkey serialize error.",&local_159);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_148);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_148._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
  local_148._M_string_length._0_4_ = 0x1b0;
  local_148.field_2._M_allocated_capacity = (long)"kCfdExtPrivkey" + 4;
  logger::warn<int&>((CfdSourceLocation *)&local_148,"bip32_key_from_seed error. ret={}",&ret);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_148,"ExtPrivkey gen from seed error.",(allocator *)&data);
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_148);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey::ExtPrivkey(const ByteData& seed, NetType network_type) {
  std::vector<uint8_t> seed_byte = seed.GetBytes();
  if ((seed_byte.size() != HDWallet::kSeed128Size) &&
      (seed_byte.size() != HDWallet::kSeed256Size) &&
      (seed_byte.size() != HDWallet::kSeed512Size)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey Seed length error.");
  }
  uint32_t version = kVersionTestnetPrivkey;
  if ((network_type == NetType::kMainnet) ||
      (network_type == NetType::kLiquidV1)) {
    version = kVersionMainnetPrivkey;
  }

  struct ext_key extkey;
  int ret = bip32_key_from_seed(
      seed_byte.data(), seed_byte.size(), version, 0, &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_from_seed error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey gen from seed error.");
  }

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(
      &extkey, BIP32_FLAG_KEY_PRIVATE, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }
  serialize_data_ = ByteData(data);

  AnalyzeBip32KeyData(
      &extkey, nullptr, nullptr, &version_, &depth_, &child_num_, &chaincode_,
      &privkey_, nullptr, &fingerprint_);
}